

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O1

void cork_io_stream(cubeb_stream_conflict *stm,pa_stream *io_stream,cork_state state)

{
  pa_operation *o;
  
  if (io_stream != (pa_stream *)0x0) {
    o = (*cubeb_pa_stream_cork)(io_stream,state & CORK,stream_success_callback,stm);
    if (o != (pa_operation *)0x0) {
      operation_wait(stm->context,io_stream,o);
      (*cubeb_pa_operation_unref)(o);
      return;
    }
  }
  return;
}

Assistant:

static void
cork_io_stream(cubeb_stream * stm, pa_stream * io_stream, enum cork_state state)
{
  pa_operation * o;
  if (!io_stream) {
    return;
  }
  o = WRAP(pa_stream_cork)(io_stream, state & CORK, stream_success_callback,
                           stm);
  if (o) {
    operation_wait(stm->context, io_stream, o);
    WRAP(pa_operation_unref)(o);
  }
}